

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusreply.h
# Opt level: O2

QDBusReply<QVariant> * __thiscall
QDBusReply<QVariant>::operator=(QDBusReply<QVariant> *this,QDBusMessage *reply)

{
  long in_FS_OFFSET;
  QVariant QStack_88;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_48._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QVariant::QVariant((QVariant *)&local_48,(QMetaType)0x123468,(void *)0x0);
  qDBusReplyFill(reply,&this->m_error,(QVariant *)&local_48);
  qvariant_cast<QDBusVariant>((QDBusVariant *)&QStack_88,(QVariant *)&local_48);
  QVariant::QVariant(&local_68,&QStack_88);
  QVariant::operator=(&this->m_data,&local_68);
  QVariant::~QVariant(&local_68);
  QVariant::~QVariant(&QStack_88);
  QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusReply<QVariant>&
QDBusReply<QVariant>::operator=(const QDBusMessage &reply)
{
    QVariant data(QMetaType::fromType<QDBusVariant>());
    qDBusReplyFill(reply, m_error, data);
    m_data = qvariant_cast<QDBusVariant>(data).variant();
    return *this;
}